

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O3

int cpu_exec_sparc64(uc_struct_conflict9 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUClass *pCVar3;
  target_ulong cs_base;
  long lVar4;
  void *pvVar5;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var6;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var7;
  vaddr vVar8;
  CPUWatchpoint *pCVar9;
  _Bool _Var10;
  char cVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  TranslationBlock *pTVar15;
  ulong uVar16;
  long lVar17;
  TranslationBlock *pTVar18;
  uint uVar19;
  TranslationBlock *pTVar20;
  uint cf_mask;
  CPUClass *pCVar21;
  TranslationBlock *pTVar22;
  TranslationBlock_conflict *pTVar23;
  list_item *plVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  target_ulong local_50;
  undefined4 local_48;
  target_ulong local_40;
  undefined4 local_38;
  
  pCVar21 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar21->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar21->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar21->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  if (iVar12 != 0) {
    pCVar21 = cpu->cc;
  }
LAB_00a2dca3:
  puVar1 = cpu->uc;
  uVar14 = cpu->exception_index;
  if (puVar1->stop_interrupt != (uc_args_int_t_conflict7)0x0) {
    _Var10 = (*puVar1->stop_interrupt)(puVar1,uVar14);
    if (_Var10) {
      plVar24 = puVar1->hook[0xe].head;
      goto joined_r0x00a2e3a4;
    }
    uVar14 = cpu->exception_index;
  }
  if (-1 < (int)uVar14) {
    if (0xffff < uVar14) {
      if (uVar14 == 0x10002) {
        pCVar3 = cpu->cc;
        if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
          for (pCVar9 = (cpu->watchpoints).tqh_first; pCVar9 != (CPUWatchpoint *)0x0;
              pCVar9 = (pCVar9->entry).tqe_next) {
            *(byte *)&pCVar9->flags = (byte)pCVar9->flags & 0x3f;
          }
        }
        (*pCVar3->debug_excp_handler)((CPUState_conflict *)cpu);
      }
      cpu->exception_index = -1;
      goto LAB_00a2e42f;
    }
    plVar24 = puVar1->hook[0].head;
    if (plVar24 == (list_item *)0x0) goto LAB_00a2e383;
    bVar25 = false;
    do {
      pvVar2 = plVar24->data;
      if (pvVar2 == (void *)0x0) break;
      if (*(char *)((long)pvVar2 + 0x14) == '\0') {
        (**(code **)((long)pvVar2 + 0x28))
                  (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
        bVar25 = true;
      }
      plVar24 = plVar24->next;
    } while (plVar24 != (list_item *)0x0);
    if (!bVar25) goto LAB_00a2e383;
    cpu->exception_index = -1;
  }
  pTVar20 = (TranslationBlock *)0x0;
  pTVar18 = pTVar20;
  while( true ) {
    pCVar3 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0xf9a) = 0;
    uVar14 = cpu->interrupt_request;
    if (uVar14 != 0) {
      uVar19 = uVar14;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar19 = uVar14 & 0xffffeda5;
      }
      if ((char)uVar19 < '\0') {
        cpu->interrupt_request = uVar14 & 0xffffff7f;
        cpu->exception_index = 0x10002;
        goto LAB_00a2dca3;
      }
      if ((uVar19 >> 10 & 1) != 0) {
        cpu_reset(cpu);
        goto LAB_00a2dca3;
      }
      _Var10 = (*pCVar3->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar19);
      if (_Var10) {
        cpu->exception_index = -1;
        pTVar18 = (TranslationBlock *)0x0;
      }
      if ((cpu->interrupt_request & 4) != 0) {
        cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
        pTVar18 = (TranslationBlock *)0x0;
      }
    }
    if (cpu->exit_request == true) break;
    uVar14 = cpu->cflags_next_tb;
    if (uVar14 == 0xffffffff) {
      uVar14 = 0;
    }
    else {
      cpu->cflags_next_tb = 0xffffffff;
    }
    pvVar2 = cpu->env_ptr;
    uVar16 = *(ulong *)((long)pvVar2 + 0x48);
    cs_base = *(target_ulong *)((long)pvVar2 + 0x50);
    uVar19 = 5;
    if (((*(byte *)((long)pvVar2 + 0x1208) & 8) != 0) &&
       ((((*(uint *)((long)pvVar2 + 0x20b0) >> 0xb & 1) == 0 ||
         ((*(byte *)((long)pvVar2 + 0x1fa0) & 4) == 0)) &&
        (uVar19 = 4, *(int *)((long)pvVar2 + 0x1c4c) == 0)))) {
      uVar19 = *(uint *)((long)pvVar2 + 0x1c48) >> 1 & 2;
    }
    uVar13 = *(uint *)((long)pvVar2 + 0x1c48);
    uVar19 = ((uVar13 & 4) << 4 | uVar19) + (uVar13 & 8) * 4;
    if ((uVar13 & 0x10) != 0 && (*(uint *)((long)pvVar2 + 0x20b0) & 1) != 0) {
      uVar19 = uVar19 + (*(uint *)((long)pvVar2 + 0x1f68) & 4) * 4;
    }
    puVar1 = cpu->uc;
    uVar19 = *(int *)((long)pvVar2 + 0x1c44) << 0x18 | uVar19;
    uVar13 = (uint)(uVar16 >> 7) ^ (uint)uVar16;
    uVar13 = uVar13 & 0x3f | uVar13 >> 7 & 0xfc0;
    pTVar15 = cpu->tb_jmp_cache[uVar13];
    cf_mask = cpu->cluster_index << 0x18 | uVar14 & 0xffffff;
    if ((((pTVar15 == (TranslationBlock *)0x0) || (pTVar15->pc != uVar16)) ||
        ((pTVar15->cs_base != cs_base ||
         ((pTVar15->flags != uVar19 || (cpu->trace_dstate[0] != (ulong)pTVar15->trace_vcpu_dstate)))
         ))) || ((pTVar15->cflags & 0xff0effff) != cf_mask)) {
      pTVar15 = tb_htable_lookup_sparc64(cpu,uVar16,cs_base,uVar19,cf_mask);
      if (pTVar15 == (TranslationBlock *)0x0) {
        pTVar15 = tb_gen_code_sparc64(cpu,uVar16,cs_base,uVar19,uVar14);
        cpu->tb_jmp_cache[uVar13] = pTVar15;
        pTVar22 = puVar1->last_tb;
        if (pTVar22 != (TranslationBlock *)0x0) {
          local_40 = pTVar15->pc;
          uVar14._0_2_ = pTVar15->size;
          uVar14._2_2_ = pTVar15->icount;
          auVar26 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0xe1);
          local_38 = auVar26._0_4_;
          local_50 = pTVar22->pc;
          uVar19._0_2_ = pTVar22->size;
          uVar19._2_2_ = pTVar22->icount;
          auVar26 = pshuflw(ZEXT416(uVar19),ZEXT416(uVar19),0xe1);
          local_48 = auVar26._0_4_;
          for (plVar24 = puVar1->hook[0xf].head;
              (plVar24 != (list_item *)0x0 && (pvVar2 = plVar24->data, pvVar2 != (void *)0x0));
              plVar24 = plVar24->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              if ((*(ulong *)((long)pvVar2 + 0x18) <= pTVar15->pc &&
                   pTVar15->pc <= *(ulong *)((long)pvVar2 + 0x20)) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      else {
        cpu->tb_jmp_cache[uVar13] = pTVar15;
      }
    }
    if ((pTVar18 != (TranslationBlock *)0x0) && (pTVar15->page_addr[1] == 0xffffffffffffffff)) {
      if (1 < (uint)pTVar20) {
        __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                      ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
      }
      if ((pTVar15->cflags & 0x40000) == 0) {
        LOCK();
        bVar25 = pTVar18->jmp_dest[(long)pTVar20] == 0;
        if (bVar25) {
          pTVar18->jmp_dest[(long)pTVar20] = (uintptr_t)pTVar15;
        }
        UNLOCK();
        if (bVar25) {
          pvVar2 = (pTVar18->tc).ptr;
          *(int *)(pTVar18->jmp_target_arg[(long)pTVar20] + (long)pvVar2) =
               (*(int *)&(pTVar15->tc).ptr -
               ((int)pTVar18->jmp_target_arg[(long)pTVar20] + (int)pvVar2)) + -4;
          pTVar18->jmp_list_next[(long)pTVar20] = pTVar15->jmp_list_head;
          pTVar15->jmp_list_head = (ulong)pTVar18 | (ulong)pTVar20;
        }
      }
    }
    if (cpu->exit_request == false) {
      pvVar2 = cpu->env_ptr;
      tb_exec_lock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
      uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x2e8) + 0x90))(pvVar2);
      if (cpu->uc->nested_level == 1) {
        tb_exec_unlock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
      }
      cpu->can_do_io = 1;
      pTVar22 = (TranslationBlock *)(uVar16 & 0xfffffffffffffffc);
      if ((uVar16 & 2) != 0) {
        if (*(long *)(*(long *)((long)pvVar2 + 0x20d8) + 0x358) == 0) {
          uVar14 = *(uint *)(*(long *)((long)pvVar2 + 0x20d8) + 0x578);
          if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
             (cpu->uc->quit_request == false)) {
            p_Var6 = cpu->cc->synchronize_from_tb;
            if (p_Var6 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
              p_Var7 = cpu->cc->set_pc;
              if (p_Var7 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_00a2e481;
              (*p_Var7)((CPUState_conflict *)cpu,pTVar22->pc);
            }
            else {
              (*p_Var6)((CPUState_conflict *)cpu,(TranslationBlock_conflict *)pTVar22);
            }
          }
        }
        cpu->tcg_exit_req = 0;
      }
      cpu->uc->last_tb = pTVar15;
      uVar14 = (uint)uVar16 & 3;
      pTVar20 = (TranslationBlock *)(ulong)uVar14;
      pTVar18 = pTVar22;
      if (uVar14 == 3) {
        pTVar18 = (TranslationBlock *)0x0;
        pTVar20 = (TranslationBlock *)0x3;
        if (-1 < *(int *)(cpu[1].tb_jmp_cache + 499)) {
          lVar4 = cpu->icount_budget;
          lVar17 = 0xffff;
          if (lVar4 < 0xffff) {
            lVar17 = lVar4;
          }
          uVar14 = (uint)lVar17;
          *(short *)(cpu[1].tb_jmp_cache + 499) = (short)lVar17;
          cpu->icount_extra = lVar4 - (int)uVar14;
          pTVar18 = (TranslationBlock *)0x0;
          pTVar20 = (TranslationBlock *)0x3;
          if (0 < (int)uVar14 && lVar4 - (int)uVar14 == 0) {
            uVar19 = 0x7fff;
            if (uVar14 < 0x7fff) {
              uVar19 = uVar14;
            }
            pTVar18 = tb_gen_code_sparc64(cpu,pTVar22->pc,pTVar22->cs_base,pTVar22->flags,
                                          uVar19 | 0x10000);
            pTVar18->orig_tb = pTVar22;
            pvVar2 = (pTVar18->tc).ptr;
            pvVar5 = cpu->env_ptr;
            tb_exec_lock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
            uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar5 + 0x20d8) + 0x2e8) + 0x90))
                               (pvVar5,pvVar2);
            if (cpu->uc->nested_level == 1) {
              tb_exec_unlock_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx);
            }
            cpu->can_do_io = 1;
            if ((uVar16 & 2) != 0) {
              if (*(long *)(*(long *)((long)pvVar5 + 0x20d8) + 0x358) == 0) {
                uVar14 = *(uint *)(*(long *)((long)pvVar5 + 0x20d8) + 0x578);
                if (((0x12 < uVar14) || ((0x771c0U >> (uVar14 & 0x1f) & 1) == 0)) &&
                   (cpu->uc->quit_request == false)) {
                  pTVar23 = (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc);
                  p_Var6 = cpu->cc->synchronize_from_tb;
                  if (p_Var6 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                    p_Var7 = cpu->cc->set_pc;
                    if (p_Var7 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_00a2e481:
                      __assert_fail("cc->set_pc",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                    ,0x61,
                                    "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)");
                    }
                    vVar8._0_4_ = pTVar23->pc;
                    vVar8._4_4_ = pTVar23->cs_base;
                    (*p_Var7)((CPUState_conflict *)cpu,vVar8);
                  }
                  else {
                    (*p_Var6)((CPUState_conflict *)cpu,pTVar23);
                  }
                }
              }
              cpu->tcg_exit_req = 0;
            }
            tb_phys_invalidate_sparc64
                      ((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar18,0xffffffffffffffff);
            tcg_tb_remove_sparc64((TCGContext_conflict8 *)cpu->uc->tcg_ctx,pTVar18);
            pTVar18 = (TranslationBlock *)0x0;
            pTVar20 = (TranslationBlock *)0x3;
          }
        }
      }
    }
  }
  cpu->exit_request = false;
  if (cpu->exception_index == -1) {
    cpu->exception_index = 0x10000;
  }
  goto LAB_00a2dca3;
joined_r0x00a2e3a4:
  if ((plVar24 == (list_item *)0x0) || (pvVar2 = plVar24->data, pvVar2 == (void *)0x0))
  goto LAB_00a2e3ce;
  if ((*(char *)((long)pvVar2 + 0x14) == '\0') &&
     (cVar11 = (**(code **)((long)pvVar2 + 0x28))(puVar1,*(undefined8 *)((long)pvVar2 + 0x30)),
     cVar11 != '\0')) goto LAB_00a2e3d9;
  plVar24 = plVar24->next;
  goto joined_r0x00a2e3a4;
LAB_00a2e3ce:
  puVar1->invalid_error = 10;
  goto LAB_00a2e3d9;
LAB_00a2e383:
  puVar1->invalid_error = 0x15;
  cpu->halted = 1;
LAB_00a2e3d9:
  uVar14 = 0x10001;
LAB_00a2e42f:
  uc->cpu->tcg_exit_req = 0;
  (*pCVar21->cpu_exec_exit)((CPUState_conflict *)cpu);
  return uVar14;
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}